

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *p,int i)

{
  int iVar1;
  int local_2c;
  int Ent;
  Gia_Obj_t *pObj;
  int i_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead( p, i )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0xa6,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
  }
  Vec_IntClear(p->vClassOld);
  Vec_IntClear(p->vClassNew);
  Vec_IntPush(p->vClassOld,i);
  Gia_ManObj(p,i);
  iVar1 = Gia_ObjIsHead(p,i);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead(p, i)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscClass.c"
                  ,0xab,"int Ssc_GiaSimClassRefineOneBit(Gia_Man_t *, int)");
  }
  for (local_2c = Gia_ObjNext(p,i); 0 < local_2c; local_2c = Gia_ObjNext(p,local_2c)) {
    iVar1 = Ssc_GiaSimAreEqualBit(p,i,local_2c);
    if (iVar1 == 0) {
      Vec_IntPush(p->vClassNew,local_2c);
    }
    else {
      Vec_IntPush(p->vClassOld,local_2c);
    }
  }
  iVar1 = Vec_IntSize(p->vClassNew);
  if (iVar1 != 0) {
    Ssc_GiaSimClassCreate(p,p->vClassOld);
    Ssc_GiaSimClassCreate(p,p->vClassNew);
  }
  p_local._4_4_ = (uint)(iVar1 != 0);
  return p_local._4_4_;
}

Assistant:

int Ssc_GiaSimClassRefineOneBit( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqualBit( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    return 1;
}